

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cc
# Opt level: O0

int __thiscall Options::operator()(Options *this,OptIter *iter,char **optarg)

{
  char cVar1;
  int iVar2;
  undefined8 *in_RDX;
  char **in_RSI;
  OptionSpec *in_RDI;
  char **in_stack_00000008;
  OptionSpec optspec;
  int get_next_arg;
  char *arg;
  int parse_opts_only;
  char *in_stack_ffffffffffffffa8;
  OptionSpec local_48;
  int local_34;
  char *local_30;
  int local_24;
  undefined8 *local_20;
  OptionSpec *iter_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_20 = in_RDX;
  iter_00 = in_RDI;
  local_24 = isOptsOnly((uint)(*(byte *)&in_RDI->spec >> 1));
  if (local_24 != 0) {
    *(byte *)&in_RDI->spec = *(byte *)&in_RDI->spec & 0xfe;
  }
  if ((in_RDI[1].spec == (char *)0x0) || (*in_RDI[1].spec == '\0')) {
    local_30 = (char *)0x0;
    local_34 = 0;
    do {
      local_30 = (char *)(**(code **)(*in_RSI + 0x10))();
      local_34 = 0;
      if (local_30 == (char *)0x0) {
        *(undefined8 *)(in_RDI + 2) = 0;
        return 0;
      }
      if ((((ulong)in_RDI->spec & 1) == 0) && (iVar2 = isEndOpts((char *)in_RDI), iVar2 != 0)) {
        (**(code **)(*in_RSI + 0x18))();
        *(undefined8 *)(in_RDI + 2) = 0;
        *(byte *)&in_RDI->spec = *(byte *)&in_RDI->spec & 0xfe | 1;
        if (local_24 != 0) {
          return 0;
        }
        local_34 = 1;
      }
    } while (local_34 != 0);
    if ((((ulong)in_RDI->spec & 1) == 0) &&
       (iVar2 = isOption((uint)(*(byte *)&in_RDI->spec >> 1),local_30), iVar2 != 0)) {
      (**(code **)(*in_RSI + 0x18))();
      if ((*(byte *)&in_RDI->spec >> 1 & 8) == 0) {
        if ((*local_30 == '-') && (local_30[1] == '-')) {
          in_RDI[1].spec = local_30 + 2;
          iVar2 = parse_longopt((Options *)optspec.spec,(OptIter *)optspec._0_8_,in_stack_00000008);
          return iVar2;
        }
        if (((*(byte *)&in_RDI->spec >> 1 & 4) != 0) && (*local_30 == '+')) {
          in_RDI[1].spec = local_30 + 1;
          iVar2 = parse_longopt((Options *)optspec.spec,(OptIter *)optspec._0_8_,in_stack_00000008);
          return iVar2;
        }
      }
      if (*local_30 == '-') {
        in_RDI[1].spec = local_30 + 1;
        if ((*(byte *)&in_RDI->spec >> 1 & 0x10) == 0) {
          iVar2 = parse_opt((Options *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                            ,(OptIter *)iter_00,in_RSI);
        }
        else {
          iVar2 = parse_longopt((Options *)optspec.spec,(OptIter *)optspec._0_8_,in_stack_00000008);
        }
      }
      else {
        OptionSpec::OptionSpec(in_RDI,in_stack_ffffffffffffffa8);
        *local_20 = local_30;
        cVar1 = OptionSpec::OptChar(&local_48);
        iVar2 = (int)cVar1;
      }
    }
    else if (local_24 == 0) {
      *local_20 = local_30;
      (**(code **)(*in_RSI + 0x18))();
      iVar2 = -4;
    }
    else {
      iVar2 = 0;
    }
  }
  else {
    iVar2 = parse_opt((Options *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                      (OptIter *)iter_00,in_RSI);
  }
  return iVar2;
}

Assistant:

int
Options::operator()(OptIter & iter, const char * & optarg) {
   int parse_opts_only = isOptsOnly(optctrls);
   if (parse_opts_only)  explicit_end = 0;

      // See if we have an option left over from before ...
   if ((nextchar) && *nextchar) {
      return  parse_opt(iter, optarg);
   }

      // Check for end-of-options ...
   const char * arg = NULLSTR;
   int get_next_arg = 0;
   do {
      arg = iter.curr();
      get_next_arg = 0;
      if (arg == NULL) {
         listopt = NULLSTR;
         return  Options::ENDOPTS;
      } else if ((! explicit_end) && isEndOpts(arg)) {
         iter.next();   // advance past end-of-options arg
         listopt = NULLSTR;
         explicit_end = 1;
         if (parse_opts_only)  return  Options::ENDOPTS;
         get_next_arg = 1;  // make sure we look at the next argument.
      }
   } while (get_next_arg);

      // Do we have a positional arg?
   if ( explicit_end || (! isOption(optctrls, arg)) ) {
      if (parse_opts_only) {
         return  Options::ENDOPTS;
      } else {
         optarg = arg;  // set optarg to the positional argument
         iter.next();   // advance iterator to the next argument
         return  Options::POSITIONAL;
      }
   }

   iter.next();  // pass the argument that arg already points to

      // See if we have a long option ...
   if (! (optctrls & Options::SHORT_ONLY)) {
      if ((*arg == '-') && (arg[1] == '-')) {
         nextchar = arg + 2;
         return  parse_longopt(iter, optarg);
      } else if ((optctrls & Options::PLUS) && (*arg == '+')) {
         nextchar = arg + 1;
         return  parse_longopt(iter, optarg);
      }
   }
   if (*arg == '-') {
      nextchar = arg + 1;
      if (optctrls & Options::LONG_ONLY) {
         return  parse_longopt(iter, optarg);
      } else {
         return  parse_opt(iter, optarg);
      }
   }

      // If we get here - it is because we have a list value
   OptionSpec  optspec = listopt;
   optarg = arg ;        // record the list value
   return  optspec.OptChar() ;
}